

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_shutdown(void)

{
  if (sqlite3Config.isInit != 0) {
    unixBigLock = (sqlite3_mutex *)0x0;
    sqlite3_reset_auto_extension();
    sqlite3Config.isInit = 0;
  }
  if (sqlite3Config.isPCacheInit != 0) {
    if (sqlite3Config.pcache2.xShutdown != (_func_void_void_ptr *)0x0) {
      (*sqlite3Config.pcache2.xShutdown)(sqlite3Config.pcache2.pArg);
    }
    sqlite3Config.isPCacheInit = 0;
  }
  if (sqlite3Config.isMallocInit != 0) {
    if (sqlite3Config.m.xShutdown != (_func_void_void_ptr *)0x0) {
      (*sqlite3Config.m.xShutdown)(sqlite3Config.m.pAppData);
    }
    mem0.mutex = (sqlite3_mutex *)0x0;
    mem0.alarmThreshold = 0;
    mem0.nearlyFull = 0;
    mem0._20_4_ = 0;
    sqlite3Config.isMallocInit = 0;
    sqlite3_data_directory = (char *)0x0;
    sqlite3_temp_directory = (char *)0x0;
  }
  if (sqlite3Config.isMutexInit != 0) {
    if (sqlite3Config.mutex.xMutexEnd != (_func_int *)0x0) {
      (*sqlite3Config.mutex.xMutexEnd)();
    }
    sqlite3Config.isMutexInit = 0;
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_shutdown(void){
#ifdef SQLITE_OMIT_WSD
  int rc = sqlite3_wsd_init(4096, 24);
  if( rc!=SQLITE_OK ){
    return rc;
  }
#endif

  if( sqlite3GlobalConfig.isInit ){
#ifdef SQLITE_EXTRA_SHUTDOWN
    void SQLITE_EXTRA_SHUTDOWN(void);
    SQLITE_EXTRA_SHUTDOWN();
#endif
    sqlite3_os_end();
    sqlite3_reset_auto_extension();
    sqlite3GlobalConfig.isInit = 0;
  }
  if( sqlite3GlobalConfig.isPCacheInit ){
    sqlite3PcacheShutdown();
    sqlite3GlobalConfig.isPCacheInit = 0;
  }
  if( sqlite3GlobalConfig.isMallocInit ){
    sqlite3MallocEnd();
    sqlite3GlobalConfig.isMallocInit = 0;

#ifndef SQLITE_OMIT_SHUTDOWN_DIRECTORIES
    /* The heap subsystem has now been shutdown and these values are supposed
    ** to be NULL or point to memory that was obtained from sqlite3_malloc(),
    ** which would rely on that heap subsystem; therefore, make sure these
    ** values cannot refer to heap memory that was just invalidated when the
    ** heap subsystem was shutdown.  This is only done if the current call to
    ** this function resulted in the heap subsystem actually being shutdown.
    */
    sqlite3_data_directory = 0;
    sqlite3_temp_directory = 0;
#endif
  }
  if( sqlite3GlobalConfig.isMutexInit ){
    sqlite3MutexEnd();
    sqlite3GlobalConfig.isMutexInit = 0;
  }

  return SQLITE_OK;
}